

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraSublimeTextGenerator::CreateNewProjectFile
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  cmMakefile *mf;
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  string *psVar4;
  ostream *poVar5;
  long lVar6;
  pointer pbVar7;
  string_view arg;
  string varValue;
  string systemName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  MapSourceFileFlags sourceFileFlags;
  string varName;
  cmGeneratedFileStream fout;
  string local_4c0;
  long *local_4a0;
  long local_498;
  long local_490 [2];
  cmMakefile *local_480;
  string local_478;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_458;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_440;
  string local_410 [3];
  ios_base local_3a0 [264];
  undefined1 local_298 [616];
  
  mf = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,filename,false,None);
  if (((byte)(*(_func_int **)(local_298._0_8_ + -0x18))[(long)(local_298 + 0x20)] & 5) != 0)
  goto LAB_0046ba73;
  psVar3 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  psVar4 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  cmSystemTools::RelativePath(&local_478,psVar3,psVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"\t\"folders\":\n\t[\n\t",0x10);
  if (local_478._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"\t{\n\t\t\t\"path\": \"./\"",0x12);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"\t{\n\t\t\t\"path\": \"",0xf);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_298,local_478._M_dataplus._M_p,local_478._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    psVar3 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_
                       (*(lgs->
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                       (*(lgs->
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    cmSystemTools::RelativePath(local_410,psVar3,psVar4);
    if (local_410[0]._M_string_length != 0) {
      if (2 < local_410[0]._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_440,(ulong)local_410);
        iVar2 = std::__cxx11::string::compare((char *)&local_440);
        if ((_Base_ptr *)local_440._M_impl._0_8_ !=
            &local_440._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_440._M_impl._0_8_,
                          (ulong)((long)&(local_440._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if (iVar2 == 0) goto LAB_0046b5f2;
      }
      if (this->ExcludeBuildFolder == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,",\n\t\t\t\"folder_exclude_patterns\": [\"",0x22);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_298,local_410[0]._M_dataplus._M_p,
                            local_410[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"]",2);
      }
    }
LAB_0046b5f2:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410[0]._M_dataplus._M_p != &local_410[0].field_2) {
      operator_delete(local_410[0]._M_dataplus._M_p,local_410[0].field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t\t}",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t]",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,",\n\t\"build_systems\":\n\t[\n\t",0x18);
  local_440._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_440 + 8);
  local_440._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_440._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_440._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_440._M_impl.super__Rb_tree_header._M_header._M_right =
       local_440._M_impl.super__Rb_tree_header._M_header._M_left;
  AppendAllTargets(this,lgs,mf,(cmGeneratedFileStream *)local_298,(MapSourceFileFlags *)&local_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t]",3);
  local_410[0]._M_dataplus._M_p = (pointer)&local_410[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"CMAKE_SYSTEM_NAME","");
  psVar3 = cmMakefile::GetSafeDefinition(mf,local_410);
  local_4a0 = local_490;
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a0,pcVar1,pcVar1 + psVar3->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410[0]._M_dataplus._M_p != &local_410[0].field_2) {
    operator_delete(local_410[0]._M_dataplus._M_p,local_410[0].field_2._M_allocated_capacity + 1);
  }
  arg._M_str = (this->EnvSettings)._M_dataplus._M_p;
  arg._M_len = (this->EnvSettings)._M_string_length;
  cmExpandedList_abi_cxx11_(&local_458,arg,false);
  if ((this->EnvSettings)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,",",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t\"env\":",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t{",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t\t",3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_298,(char *)local_4a0,local_498);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t\t{",4);
    local_480 = mf;
    if (local_458.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_458.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar7 = local_458.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        lVar6 = std::__cxx11::string::find((char)pbVar7,0x3d);
        if (lVar6 == -1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_410,
                     "Could not parse Env Vars specified in \"CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS\"",
                     0x49);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_410,", corrupted string ",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_410,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(local_480,FATAL_ERROR,&local_4c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
            operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
          std::ios_base::~ios_base(local_3a0);
        }
        else {
          std::__cxx11::string::substr((ulong)local_410,(ulong)pbVar7);
          std::__cxx11::string::substr((ulong)&local_4c0,(ulong)pbVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t\t\t\"",5);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_298,local_410[0]._M_dataplus._M_p,
                              local_410[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\":\"",3);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
            operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410[0]._M_dataplus._M_p != &local_410[0].field_2) {
            operator_delete(local_410[0]._M_dataplus._M_p,
                            local_410[0].field_2._M_allocated_capacity + 1);
          }
        }
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != local_458.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t\t}",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t}",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n}",2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_458);
  if (local_4a0 != local_490) {
    operator_delete(local_4a0,local_490[0] + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
LAB_0046ba73:
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::CreateNewProjectFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& filename)
{
  const cmMakefile* mf = lgs[0]->GetMakefile();

  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  const std::string& sourceRootRelativeToOutput = cmSystemTools::RelativePath(
    lgs[0]->GetBinaryDirectory(), lgs[0]->GetSourceDirectory());
  // Write the folder entries to the project file
  fout << "{\n";
  fout << "\t\"folders\":\n\t[\n\t";
  if (!sourceRootRelativeToOutput.empty()) {
    fout << "\t{\n\t\t\t\"path\": \"" << sourceRootRelativeToOutput << "\"";
    const std::string& outputRelativeToSourceRoot =
      cmSystemTools::RelativePath(lgs[0]->GetSourceDirectory(),
                                  lgs[0]->GetBinaryDirectory());
    if ((!outputRelativeToSourceRoot.empty()) &&
        ((outputRelativeToSourceRoot.length() < 3) ||
         (outputRelativeToSourceRoot.substr(0, 3) != "../"))) {
      if (this->ExcludeBuildFolder) {
        fout << ",\n\t\t\t\"folder_exclude_patterns\": [\""
             << outputRelativeToSourceRoot << "\"]";
      }
    }
  } else {
    fout << "\t{\n\t\t\t\"path\": \"./\"";
  }
  fout << "\n\t\t}";
  // End of the folders section
  fout << "\n\t]";

  // Write the beginning of the build systems section to the project file
  fout << ",\n\t\"build_systems\":\n\t[\n\t";

  // Set of include directories over all targets (sublime text/sublimeclang
  // doesn't currently support these settings per build system, only project
  // wide
  MapSourceFileFlags sourceFileFlags;
  this->AppendAllTargets(lgs, mf, fout, sourceFileFlags);

  // End of build_systems
  fout << "\n\t]";
  std::string systemName = mf->GetSafeDefinition("CMAKE_SYSTEM_NAME");
  std::vector<std::string> tokens = cmExpandedList(this->EnvSettings);

  if (!this->EnvSettings.empty()) {
    fout << ",";
    fout << "\n\t\"env\":";
    fout << "\n\t{";
    fout << "\n\t\t" << systemName << ":";
    fout << "\n\t\t{";
    for (std::string const& t : tokens) {
      size_t const pos = t.find_first_of('=');

      if (pos != std::string::npos) {
        std::string varName = t.substr(0, pos);
        std::string varValue = t.substr(pos + 1);

        fout << "\n\t\t\t\"" << varName << "\":\"" << varValue << "\"";
      } else {
        std::ostringstream e;
        e << "Could not parse Env Vars specified in "
             "\"CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS\""
          << ", corrupted string " << t;
        mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      }
    }
    fout << "\n\t\t}";
    fout << "\n\t}";
  }
  fout << "\n}";
}